

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbezier.cpp
# Opt level: O3

void __thiscall
QBezier::addToPolygon(QBezier *this,QPolygonF *polygon,qreal bezier_flattening_threshold)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  int levels [10];
  QPointF local_2e8;
  undefined8 local_2d8;
  undefined1 *puStack_2d0;
  undefined1 *local_2c8;
  undefined1 *puStack_2c0;
  undefined1 *local_2b8;
  qreal local_2a8 [4];
  qreal local_288 [4];
  double local_268 [73];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_2b8 = &DAT_aaaaaaaaaaaaaaaa;
  local_2c8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_2c0 = &DAT_aaaaaaaaaaaaaaaa;
  local_2d8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_2d0 = &DAT_aaaaaaaaaaaaaaaa;
  memset(local_268,0xff,0x240);
  local_2a8[0] = this->x1;
  local_2a8[1] = this->y1;
  local_2a8[2] = this->x2;
  local_2a8[3] = this->y2;
  local_288[0] = this->x3;
  local_288[1] = this->y3;
  local_288[2] = this->x4;
  local_288[3] = this->y4;
  local_2d8 = (undefined1 *)CONCAT44(local_2d8._4_4_,9);
  uVar4 = 0;
  do {
    uVar6 = (ulong)uVar4;
    dVar2 = local_2a8[uVar6 * 8];
    dVar3 = local_2a8[uVar6 * 8 + 1];
    dVar10 = local_288[uVar6 * 8 + 2];
    dVar12 = local_268[uVar6 * 8 + -1];
    dVar16 = dVar10 - dVar2;
    dVar17 = dVar12 - dVar3;
    dVar20 = -dVar17;
    uVar7 = -(ulong)(dVar16 < -dVar16);
    dVar17 = (double)(~-(ulong)(dVar17 < dVar20) & (ulong)dVar17 |
                     (ulong)dVar20 & -(ulong)(dVar17 < dVar20)) +
             (double)(~uVar7 & (ulong)dVar16 | (ulong)-dVar16 & uVar7);
    if (dVar17 <= 1.0) {
      dVar11 = local_2a8[uVar6 * 8 + 2];
      dVar13 = local_288[uVar6 * 8 + -1];
      dVar15 = local_288[uVar6 * 8];
      dVar14 = local_288[uVar6 * 8 + 1];
      dVar17 = dVar2 - dVar11;
      dVar16 = dVar3 - dVar13;
      uVar7 = -(ulong)(dVar17 < -dVar17);
      uVar9 = -(ulong)(dVar16 < -dVar16);
      dVar20 = dVar2 - dVar15;
      dVar19 = dVar3 - dVar14;
      uVar8 = -(ulong)(dVar20 < -dVar20);
      dVar18 = (double)(~uVar8 & (ulong)dVar20 | (ulong)-dVar20 & uVar8) +
               (double)(~uVar9 & (ulong)dVar16 | (ulong)-dVar16 & uVar9) +
               (double)(~uVar7 & (ulong)dVar17 | (ulong)-dVar17 & uVar7);
      dVar17 = 1.0;
    }
    else {
      dVar11 = local_2a8[uVar6 * 8 + 2];
      dVar13 = local_288[uVar6 * 8 + -1];
      dVar15 = local_288[uVar6 * 8];
      dVar14 = local_288[uVar6 * 8 + 1];
      dVar18 = (dVar3 - dVar13) * dVar16 + (dVar2 - dVar11) * dVar20;
      uVar7 = -(ulong)(dVar18 < -dVar18);
      dVar18 = (double)(~uVar7 & (ulong)dVar18 | (ulong)-dVar18 & uVar7);
      dVar19 = (dVar3 - dVar14) * dVar16 + (dVar2 - dVar15) * dVar20;
    }
    uVar7 = -(ulong)(dVar19 < -dVar19);
    if (((double)(~uVar7 & (ulong)dVar19 | (ulong)-dVar19 & uVar7) + dVar18 <
         dVar17 * bezier_flattening_threshold) ||
       (iVar5 = *(int *)((long)&local_2d8 + uVar6 * 4), iVar5 == 0)) {
      local_2e8.xp = dVar10;
      local_2e8.yp = dVar12;
      QtPrivate::QPodArrayOps<QPointF>::emplace<QPointF>
                ((QPodArrayOps<QPointF> *)polygon,(polygon->super_QList<QPointF>).d.size,&local_2e8)
      ;
      QList<QPointF>::end(&polygon->super_QList<QPointF>);
      uVar4 = uVar4 - 1;
    }
    else {
      local_268[uVar6 * 8] = dVar2;
      local_268[uVar6 * 8 + 1] = dVar3;
      dVar17 = (dVar2 + dVar11) * 0.5;
      dVar16 = (dVar3 + dVar13) * 0.5;
      dVar20 = (dVar11 + dVar15) * 0.5;
      dVar11 = (dVar13 + dVar14) * 0.5;
      dVar2 = (dVar10 + dVar15) * 0.5;
      dVar3 = (dVar12 + dVar14) * 0.5;
      dVar13 = (dVar17 + dVar20) * 0.5;
      dVar15 = (dVar16 + dVar11) * 0.5;
      dVar10 = (dVar20 + dVar2) * 0.5;
      dVar12 = (dVar11 + dVar3) * 0.5;
      local_268[uVar6 * 8 + 2] = dVar17;
      local_268[uVar6 * 8 + 3] = dVar16;
      local_268[uVar6 * 8 + 4] = dVar13;
      local_268[uVar6 * 8 + 5] = dVar15;
      dVar17 = (dVar13 + dVar10) * 0.5;
      dVar16 = (dVar15 + dVar12) * 0.5;
      local_268[uVar6 * 8 + 6] = dVar17;
      local_268[uVar6 * 8 + 7] = dVar16;
      local_2a8[uVar6 * 8] = dVar17;
      local_2a8[uVar6 * 8 + 1] = dVar16;
      local_2a8[uVar6 * 8 + 2] = dVar10;
      local_288[uVar6 * 8 + -1] = dVar12;
      auVar1._8_4_ = SUB84(dVar3,0);
      auVar1._0_8_ = dVar2;
      auVar1._12_4_ = (int)((ulong)dVar3 >> 0x20);
      *(undefined1 (*) [16])(local_288 + uVar6 * 8) = auVar1;
      iVar5 = iVar5 + -1;
      *(int *)((long)&local_2d8 + uVar6 * 4) = iVar5;
      *(int *)((long)&local_2d8 + uVar6 * 4 + 4) = iVar5;
      uVar4 = uVar4 + 1;
    }
  } while (-1 < (int)uVar4);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QBezier::addToPolygon(QPolygonF *polygon, qreal bezier_flattening_threshold) const
{
    QBezier beziers[10];
    int levels[10];
    beziers[0] = *this;
    levels[0] = 9;
    int top = 0;

    while (top >= 0) {
        QBezier *b = &beziers[top];
        // check if we can pop the top bezier curve from the stack
        qreal y4y1 = b->y4 - b->y1;
        qreal x4x1 = b->x4 - b->x1;
        qreal l = qAbs(x4x1) + qAbs(y4y1);
        qreal d;
        if (l > 1.) {
            d = qAbs( (x4x1)*(b->y1 - b->y2) - (y4y1)*(b->x1 - b->x2) )
                + qAbs( (x4x1)*(b->y1 - b->y3) - (y4y1)*(b->x1 - b->x3) );
        } else {
            d = qAbs(b->x1 - b->x2) + qAbs(b->y1 - b->y2) +
                qAbs(b->x1 - b->x3) + qAbs(b->y1 - b->y3);
            l = 1.;
        }
        if (d < bezier_flattening_threshold * l || levels[top] == 0) {
            // good enough, we pop it off and add the endpoint
            polygon->append(QPointF(b->x4, b->y4));
            --top;
        } else {
            // split, second half of the polygon goes lower into the stack
            std::tie(b[1], b[0]) = b->split();
            levels[top + 1] = --levels[top];
            ++top;
        }
    }
}